

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O2

void __thiscall
bssl::gtest_suite_PkitsTest03VerifyingNameChaining_::
Section3InvalidNameChainingOrderTest2<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
::TestBody(Section3InvalidNameChainingOrderTest2<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
           *this)

{
  PkitsTestInfo *in_RCX;
  PkitsTestInfo info;
  PkitsTestInfo local_88;
  
  PkitsTestInfo::PkitsTestInfo(&local_88);
  local_88.test_number = "4.3.2";
  local_88.should_validate = false;
  PkitsTest<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>::RunTest<3ul,2ul>
            ((PkitsTest<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate> *)
             &PTR_anon_var_dwarf_28892d_005b30b0,(char *(*) [3])&PTR_anon_var_dwarf_28895f_005b30d0,
             &local_88.test_number,in_RCX);
  PkitsTestInfo::~PkitsTestInfo(&local_88);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest03VerifyingNameChaining,
                     Section3InvalidNameChainingOrderTest2) {
  const char* const certs[] = {"TrustAnchorRootCertificate",
                               "NameOrderingCACert",
                               "InvalidNameChainingOrderTest2EE"};
  const char* const crls[] = {"TrustAnchorRootCRL", "NameOrderCACRL"};
  PkitsTestInfo info;
  info.test_number = "4.3.2";
  info.should_validate = false;

  this->RunTest(certs, crls, info);
}